

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O2

ostream * lambda::operator<<(ostream *os,Parse_ast *ast)

{
  __index_type _Var1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:17:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:18:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  local_20;
  
  _Var1 = *(__index_type *)
           ((long)&(ast->underlying_).
                   super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Variant_storage_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
           + 0x28);
  local_20.super_anon_class_8_1_3fcf66a2.os = os;
  local_20.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:18:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  .super_anon_class_8_1_3fcf66a2.os = os;
  local_20.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:18:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  .super_anon_class_8_1_3fcf66a2.os = (anon_class_8_1_3fcf66a2)(anon_class_8_1_3fcf66a2)os;
  if (_Var1 == 0xff) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    _Var1 = *(__index_type *)
             ((long)&(ast->underlying_).
                     super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Variant_storage_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
             + 0x28);
  }
  pbVar2 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::basic_ostream<char,_std::char_traits<char>_>_&>,_ublib::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/parse_ast.cpp:17:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/parse_ast.cpp:18:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/parse_ast.cpp:21:7)>_&&,_const_std::variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>_&>
             ::_S_vtable._M_arr[(char)_Var1]._M_data)(&local_20,&ast->underlying_);
  return pbVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Parse_ast const& ast) noexcept {
  return match(ast)(
      [&](Parse_ast::Variable const& v) -> std::ostream& { return os << v.name(); },
      [&](Parse_ast::Call const& v) -> std::ostream& {
        return os << v.callee() << ' ' << v.argument();
      },
      [&](Parse_ast::Lambda const& v) -> std::ostream& {
        return os << '(' << '/' << v.parameter() << '.' << v.expression()
                  << ')';
      });
}